

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<1,458>::print<std::back_insert_iterator<std::__cxx11::string>>
          (Type<1,458> *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF)

{
  Type<1,458> *__variants;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_1_458_hpp:67:42),_const_std::variant<njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents,_njoy::ENDFtk::section::Type<1,_458>::PolynomialComponents,_njoy::ENDFtk::section::Type<1,_458>::TabulatedComponents>_&>
  _Var1;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_1_458_hpp:79:42),_const_std::variant<njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents,_njoy::ENDFtk::section::Type<1,_458>::PolynomialComponents,_njoy::ENDFtk::section::Type<1,_458>::TabulatedComponents>_&>
  _Var2;
  int local_8c;
  double local_88;
  double local_80;
  int local_74;
  StructureDivision local_70;
  
  local_80 = (double)*(int *)this;
  local_88 = *(double *)(this + 8);
  __variants = this + 0x10;
  local_8c = MAT;
  local_74 = MF;
  _Var1 = std::
          visit<njoy::ENDFtk::section::Type<1,458>::LFC()const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<1,458>::ThermalPointComponents,njoy::ENDFtk::section::Type<1,458>::PolynomialComponents,njoy::ENDFtk::section::Type<1,458>::TabulatedComponents>const&>
                    ((anon_class_1_0_00000001 *)&local_70,
                     (variant<njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents,_njoy::ENDFtk::section::Type<1,_458>::PolynomialComponents,_njoy::ENDFtk::section::Type<1,_458>::TabulatedComponents>
                      *)__variants);
  _Var2 = std::
          visit<njoy::ENDFtk::section::Type<1,458>::NFC()const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<1,458>::ThermalPointComponents,njoy::ENDFtk::section::Type<1,458>::PolynomialComponents,njoy::ENDFtk::section::Type<1,458>::TabulatedComponents>const&>
                    ((anon_class_1_0_00000001 *)&local_70,
                     (variant<njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents,_njoy::ENDFtk::section::Type<1,_458>::PolynomialComponents,_njoy::ENDFtk::section::Type<1,_458>::TabulatedComponents>
                      *)__variants);
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)(long)(int)_Var2;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 0
  ;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = local_88;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = local_80;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)(int)_Var1;
  ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ControlRecord *)&local_70,it,local_8c,local_74,0x1ca);
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)(_Head_base<5UL,_long,_false>)this;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = (long)it;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)&local_8c;
  local_70.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)&local_74;
  std::
  visit<njoy::ENDFtk::section::Type<1,458>::print<std::back_insert_iterator<std::__cxx11::string>>(std::back_insert_iterator<std::__cxx11::string>&,int,int)const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<1,458>::ThermalPointComponents,njoy::ENDFtk::section::Type<1,458>::PolynomialComponents,njoy::ENDFtk::section::Type<1,458>::TabulatedComponents>const&>
            ((anon_class_32_4_c8a9f2b7 *)&local_70,
             (variant<njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents,_njoy::ENDFtk::section::Type<1,_458>::PolynomialComponents,_njoy::ENDFtk::section::Type<1,_458>::TabulatedComponents>
              *)__variants);
  sectionEndRecord(&local_70,local_8c,local_74);
  StructureDivision::print<std::back_insert_iterator<std::__cxx11::string>>(&local_70,it);
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF ) const {

  ControlRecord( this->ZA(), this->AWR(), 0,
                 this->LFC(), 0, this->NFC() ).print( it, MAT, MF, MT() );
  std::visit( [&] ( const auto& v ) -> void
                  { v.print( it, MAT, MF, MT() ); },
              this->data_ );
  SEND( MAT, MF ).print( it );
}